

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::detail::redirect<httplib::Client>
          (detail *this,Client *cli,Request *req,Response *res,string *path)

{
  ulong uVar1;
  int __flags;
  undefined1 local_2f8 [7];
  bool ret;
  Response new_res;
  undefined1 local_228 [8];
  Request new_req;
  string *path_local;
  Response *res_local;
  Request *req_local;
  Client *cli_local;
  
  __flags = (int)path;
  new_req.content_provider._M_invoker = (_Invoker_type)res;
  Request::Request((Request *)local_228);
  std::__cxx11::string::operator=((string *)local_228,(string *)cli);
  std::__cxx11::string::operator=
            ((string *)(new_req.method.field_2._M_local_buf + 8),
             (string *)new_req.content_provider._M_invoker);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&new_req.path.field_2 + 8),
              (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(cli->host_and_port_)._M_string_length);
  std::__cxx11::string::operator=
            ((string *)&new_req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)&cli->follow_location_);
  new_req.matches._M_begin._M_current = (char *)((long)cli[3]._vptr_Client + -1);
  std::function<bool_(const_httplib::Response_&)>::operator=
            ((function<bool_(const_httplib::Response_&)> *)&new_req.redirect_count,
             (function<bool_(const_httplib::Response_&)> *)&cli[3].host_);
  std::function<bool_(const_char_*,_unsigned_long)>::operator=
            ((function<bool_(const_char_*,_unsigned_long)> *)&new_req.response_handler._M_invoker,
             (function<bool_(const_char_*,_unsigned_long)> *)&cli[3].port_);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&new_req.content_receiver._M_invoker,
             (function<bool_(unsigned_long,_unsigned_long)> *)&cli[3].host_and_port_.field_2);
  Response::Response((Response *)local_2f8);
  uVar1 = Client::send((Client *)this,(int)local_228,local_2f8,(size_t)res,__flags);
  if ((uVar1 & 1) != 0) {
    Response::operator=((Response *)req,(Response *)local_2f8);
  }
  Response::~Response((Response *)local_2f8);
  Request::~Request((Request *)local_228);
  return (bool)((byte)uVar1 & 1);
}

Assistant:

inline bool redirect(T &cli, const Request &req, Response &res,
                     const std::string &path) {
  Request new_req;
  new_req.method = req.method;
  new_req.path = path;
  new_req.headers = req.headers;
  new_req.body = req.body;
  new_req.redirect_count = req.redirect_count - 1;
  new_req.response_handler = req.response_handler;
  new_req.content_receiver = req.content_receiver;
  new_req.progress = req.progress;

  Response new_res;
  auto ret = cli.send(new_req, new_res);
  if (ret) { res = new_res; }
  return ret;
}